

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QItemDelegate * __thiscall
QItemDelegate::selectedPixmap(QItemDelegate *this,QPixmap *pixmap,QPalette *palette,bool enabled)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QColor *pQVar5;
  undefined7 in_register_00000009;
  long lVar6;
  QChar *pQVar7;
  long in_FS_OFFSET;
  QPainter painter;
  QImage local_b0 [24];
  QArrayDataPointer<char16_t> local_98;
  QColor local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  QChar local_48;
  ushort local_46;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uVar4 = QPixmap::cacheKey();
  pQVar7 = &local_48;
  local_58 = (undefined1 *)0x0;
  uStack_50 = 0;
  local_68 = (undefined1 *)0x0;
  puStack_60 = (undefined1 *)0x0;
  local_48.ucs = L'-';
  local_46 = (ushort)CONCAT71(in_register_00000009,enabled) | 0x30;
  lVar6 = 0x200000000;
  for (; uVar4 != 0; uVar4 = uVar4 >> 4) {
    pQVar7[-1].ucs = (ushort)uVar4 & 0xf | 0x30;
    pQVar7 = pQVar7 + -1;
    lVar6 = lVar6 + 0x100000000;
  }
  QString::QString((QString *)&local_98,pQVar7,lVar6 >> 0x20);
  *(undefined1 **)&this[1].super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QAbstractItemDelegate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this);
  cVar1 = QPixmapCache::find((QString *)&local_98,(QPixmap *)this);
  if (cVar1 == '\0') {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::toImage();
    QImage::convertToFormat((QImage *)&local_68,(Format)local_b0,(ImageConversionFlags)0x6);
    QImage::~QImage(local_b0);
    pQVar5 = QPalette::color(palette,(uint)!enabled,Highlight);
    local_78._0_8_ = *(undefined8 *)pQVar5;
    local_78._8_8_ = *(undefined8 *)((long)&pQVar5->ct + 4);
    QColor::setAlphaF(0.3);
    _painter = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&painter,(QPaintDevice *)&local_68);
    QPainter::setCompositionMode((CompositionMode)&painter);
    iVar2 = QImage::width();
    iVar3 = QImage::height();
    QPainter::fillRect(&painter,0,0,iVar2,iVar3,&local_78);
    QPainter::end();
    QPixmap::fromImage((QPixmap *)local_b0,(QImage *)&local_68,0);
    QPixmap::operator=((QPixmap *)this,(QPixmap *)local_b0);
    QPixmap::~QPixmap((QPixmap *)local_b0);
    uVar4 = QImage::sizeInBytes();
    iVar3 = (int)(uVar4 >> 10) + 1;
    iVar2 = QPixmapCache::cacheLimit();
    if (iVar2 < iVar3) {
      QPixmapCache::setCacheLimit(iVar3);
    }
    QPixmapCache::insert((QString *)&local_98,(QPixmap *)this);
    QPainter::~QPainter(&painter);
    QImage::~QImage((QImage *)&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QItemDelegate::selectedPixmap(const QPixmap &pixmap, const QPalette &palette, bool enabled)
{
    const QString key = qPixmapSerial(pixmap.cacheKey(), enabled);
    QPixmap pm;
    if (!QPixmapCache::find(key, &pm)) {
        QImage img = pixmap.toImage().convertToFormat(QImage::Format_ARGB32_Premultiplied);

        QColor color = palette.color(enabled ? QPalette::Normal : QPalette::Disabled,
                                     QPalette::Highlight);
        color.setAlphaF(0.3f);

        QPainter painter(&img);
        painter.setCompositionMode(QPainter::CompositionMode_SourceAtop);
        painter.fillRect(0, 0, img.width(), img.height(), color);
        painter.end();

        pm = QPixmap(QPixmap::fromImage(img));
        const int n = (img.sizeInBytes() >> 10) + 1;
        if (QPixmapCache::cacheLimit() < n)
            QPixmapCache::setCacheLimit(n);

        QPixmapCache::insert(key, pm);
    }
    return pm;
}